

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshfile_operations.cpp
# Opt level: O2

void sort_element(iterator *element_iteration)

{
  _Base_ptr p_Var1;
  _Base_ptr local_20;
  undefined4 local_18;
  
  local_20 = element_iteration->_M_node[1]._M_parent;
  local_18 = *(undefined4 *)&element_iteration->_M_node[1]._M_left;
  std::__sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(&local_20);
  p_Var1 = element_iteration->_M_node;
  p_Var1[1]._M_parent = local_20;
  *(undefined4 *)&p_Var1[1]._M_left = local_18;
  return;
}

Assistant:

void sort_element(std::map<int, elements>::iterator &element_iteration)
{
    int placeholder[3]={    element_iteration->second.element_properties[1],
                            element_iteration->second.element_properties[2],
                            element_iteration->second.element_properties[3]};
    int n = sizeof(placeholder)/sizeof(placeholder[0]);
    std::sort(placeholder, placeholder+n);
    element_iteration->second.element_properties[1]= placeholder[0];
    element_iteration->second.element_properties[2]= placeholder[1];
    element_iteration->second.element_properties[3]= placeholder[2];
}